

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_0::MembranePipelineHook::~MembranePipelineHook(MembranePipelineHook *this)

{
  MembranePipelineHook *this_local;
  
  ~MembranePipelineHook(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

MembranePipelineHook(
      kj::Own<PipelineHook>&& inner, kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), reverse(reverse) {}